

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_test_control(int op,...)

{
  sqlite3_mutex **ppsVar1;
  undefined4 uVar2;
  uint n_00;
  sqlite3 *xBenignBegin_00;
  _func_void *xBenignEnd_00;
  char in_AL;
  int iVar3;
  void *pvVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_3a8;
  undefined4 *local_390;
  undefined8 *local_378;
  undefined1 local_158 [8];
  sqlite3 *local_150;
  _func_void *local_148;
  void **local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  sqlite3 *local_a8;
  sqlite3 *db_3;
  sqlite3 *db_2;
  _func_void *p_Stack_90;
  int sz_1;
  void **ppNew;
  void *pFree;
  sqlite3 *psStack_78;
  int n;
  char *zWord;
  sqlite3 *db_1;
  sqlite3 *psStack_60;
  int x_2;
  sqlite3 *db;
  int x_1;
  int x;
  uint newVal;
  void_function xBenignEnd;
  void_function xBenignBegin;
  int *aProg;
  uint local_28;
  int sz;
  va_list ap;
  int rc;
  int op_local;
  
  xBenignEnd_00 = local_148;
  xBenignBegin_00 = local_150;
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  ap[0].reg_save_area._0_4_ = 0;
  ap[0].overflow_arg_area = local_158;
  ap[0]._0_8_ = &stack0x00000008;
  sz = 0x30;
  local_28 = 8;
  n_00 = (uint)local_150;
  local_138 = in_R8;
  local_130 = in_R9;
  ap[0].reg_save_area._4_4_ = op;
  switch(op) {
  case 5:
    local_150 = (sqlite3 *)in_RSI;
    local_148 = (_func_void *)in_RDX;
    local_140 = (void **)in_RCX;
    sqlite3PrngSaveState();
    break;
  case 6:
    local_150 = (sqlite3 *)in_RSI;
    local_148 = (_func_void *)in_RDX;
    local_140 = (void **)in_RCX;
    sqlite3PrngRestoreState();
    break;
  case 7:
    local_150 = (sqlite3 *)in_RSI;
    local_148 = (_func_void *)in_RDX;
    local_140 = (void **)in_RCX;
    sqlite3_randomness(0,(void *)0x0);
    break;
  case 8:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    aProg._4_4_ = (uint)local_150;
    local_28 = 0x18;
    local_150 = (sqlite3 *)in_RSI;
    local_148 = (_func_void *)in_RDX;
    local_140 = (void **)in_RCX;
    ap[0].reg_save_area._0_4_ = sqlite3BitvecBuiltinTest(n_00,(int *)xBenignEnd_00);
    break;
  case 9:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    local_28 = 0x10;
    sqlite3Config.xTestCallback = (_func_int_int *)local_150;
    local_150 = (sqlite3 *)in_RSI;
    local_148 = (_func_void *)in_RDX;
    local_140 = (void **)in_RCX;
    ap[0].reg_save_area._0_4_ = sqlite3FaultSim(0);
    break;
  case 10:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    local_28 = 0x18;
    local_150 = (sqlite3 *)in_RSI;
    local_148 = (_func_void *)in_RDX;
    local_140 = (void **)in_RCX;
    sqlite3BenignMallocHooks((_func_void *)xBenignBegin_00,xBenignEnd_00);
    break;
  case 0xb:
    ap[0].reg_save_area._0_4_ = sqlite3PendingByte;
    if ((uint)local_150 != 0) {
      sqlite3PendingByte = (uint)local_150;
    }
    break;
  case 0xc:
    ap[0].reg_save_area._0_4_ = 0;
    break;
  case 0xd:
    ap[0].reg_save_area._0_4_ = (uint)local_150;
    break;
  case 0xe:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    psStack_60 = local_150;
    local_28 = 0x18;
    db_1._4_4_ = (int)local_148;
    ppsVar1 = &local_150->mutex;
    local_150 = (sqlite3 *)in_RSI;
    local_148 = (_func_void *)in_RDX;
    local_140 = (void **)in_RCX;
    sqlite3_mutex_enter(*ppsVar1);
    sqlite3BtreeSetPageSize(psStack_60->aDb->pBt,0,db_1._4_4_,0);
    sqlite3_mutex_leave(psStack_60->mutex);
    break;
  case 0xf:
    ap[0].reg_save_area._0_4_ = 0;
    local_150->dbOptFlags = (u16)local_148;
    break;
  case 0x10:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    local_28 = 0x10;
    psStack_78 = local_150;
    local_150 = (sqlite3 *)in_RSI;
    local_148 = (_func_void *)in_RDX;
    local_140 = (void **)in_RCX;
    pFree._4_4_ = sqlite3Strlen30((char *)xBenignBegin_00);
    iVar3 = sqlite3KeywordCode((uchar *)psStack_78,pFree._4_4_);
    ap[0].reg_save_area._0_4_ = 0;
    if (iVar3 != 0x1b) {
      ap[0].reg_save_area._0_4_ = 0x7c;
    }
    break;
  case 0x11:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    db_2._4_4_ = (uint)local_150;
    p_Stack_90 = local_148;
    local_28 = 0x20;
    ppNew = local_140;
    bVar5 = (uint)local_150 != 0;
    local_150 = (sqlite3 *)in_RSI;
    local_148 = (_func_void *)in_RDX;
    local_140 = (void **)in_RCX;
    if (bVar5) {
      pvVar4 = sqlite3ScratchMalloc(n_00);
      *(void **)p_Stack_90 = pvVar4;
    }
    sqlite3ScratchFree(ppNew);
    break;
  case 0x12:
    ap[0].reg_save_area._0_4_ = 0;
    sqlite3Config.bLocaltimeFault = (uint)local_150;
    break;
  case 0x13:
    ap[0].reg_save_area._0_4_ = 0;
    sqlite3Config.iOnceResetThreshold = (uint)local_150;
    break;
  case 0x14:
    ap[0].reg_save_area._0_4_ = 0;
    sqlite3Config.neverCorrupt = (uint)local_150;
    break;
  case 0x15:
    break;
  case 0x16:
    ap[0].reg_save_area._0_4_ = 0x1e212;
    break;
  case 0x17:
    ap[0].reg_save_area._1_3_ = 0;
    ap[0].reg_save_area._0_1_ = sqlite3Config.isInit == 0;
    break;
  case 0x18:
    ap[0].reg_save_area._0_4_ = 0;
    local_150->nMaxSorterMmap = (int)local_148;
    break;
  case 0x19:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    local_28 = 0x10;
    local_a8 = local_150;
    ppsVar1 = &local_150->mutex;
    local_150 = (sqlite3 *)in_RSI;
    local_148 = (_func_void *)in_RDX;
    local_140 = (void **)in_RCX;
    sqlite3_mutex_enter(*ppsVar1);
    if (local_28 < 0x29) {
      local_378 = (undefined8 *)((long)(int)local_28 + (long)ap[0].overflow_arg_area);
      local_28 = local_28 + 8;
    }
    else {
      local_378 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    iVar3 = sqlite3FindDbName(local_a8,(char *)*local_378);
    (local_a8->init).iDb = (u8)iVar3;
    if (local_28 < 0x29) {
      local_390 = (undefined4 *)((long)(int)local_28 + (long)ap[0].overflow_arg_area);
      local_28 = local_28 + 8;
    }
    else {
      local_390 = (undefined4 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    uVar2 = *local_390;
    (local_a8->init).imposterTable = (u8)uVar2;
    (local_a8->init).busy = (u8)uVar2;
    if (local_28 < 0x29) {
      local_3a8 = (int *)((long)(int)local_28 + (long)ap[0].overflow_arg_area);
      local_28 = local_28 + 8;
    }
    else {
      local_3a8 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    (local_a8->init).newTnum = *local_3a8;
    if (((local_a8->init).busy == '\0') && (0 < (local_a8->init).newTnum)) {
      sqlite3ResetAllSchemasOfConnection(local_a8);
    }
    sqlite3_mutex_leave(local_a8->mutex);
  }
  return (uint)ap[0].reg_save_area;
}

Assistant:

SQLITE_API int sqlite3_test_control(int op, ...){
  int rc = 0;
#ifdef SQLITE_UNTESTABLE
  UNUSED_PARAMETER(op);
#else
  va_list ap;
  va_start(ap, op);
  switch( op ){

    /*
    ** Save the current state of the PRNG.
    */
    case SQLITE_TESTCTRL_PRNG_SAVE: {
      sqlite3PrngSaveState();
      break;
    }

    /*
    ** Restore the state of the PRNG to the last state saved using
    ** PRNG_SAVE.  If PRNG_SAVE has never before been called, then
    ** this verb acts like PRNG_RESET.
    */
    case SQLITE_TESTCTRL_PRNG_RESTORE: {
      sqlite3PrngRestoreState();
      break;
    }

    /*
    ** Reset the PRNG back to its uninitialized state.  The next call
    ** to sqlite3_randomness() will reseed the PRNG using a single call
    ** to the xRandomness method of the default VFS.
    */
    case SQLITE_TESTCTRL_PRNG_RESET: {
      sqlite3_randomness(0,0);
      break;
    }

    /*
    **  sqlite3_test_control(BITVEC_TEST, size, program)
    **
    ** Run a test against a Bitvec object of size.  The program argument
    ** is an array of integers that defines the test.  Return -1 on a
    ** memory allocation error, 0 on success, or non-zero for an error.
    ** See the sqlite3BitvecBuiltinTest() for additional information.
    */
    case SQLITE_TESTCTRL_BITVEC_TEST: {
      int sz = va_arg(ap, int);
      int *aProg = va_arg(ap, int*);
      rc = sqlite3BitvecBuiltinTest(sz, aProg);
      break;
    }

    /*
    **  sqlite3_test_control(FAULT_INSTALL, xCallback)
    **
    ** Arrange to invoke xCallback() whenever sqlite3FaultSim() is called,
    ** if xCallback is not NULL.
    **
    ** As a test of the fault simulator mechanism itself, sqlite3FaultSim(0)
    ** is called immediately after installing the new callback and the return
    ** value from sqlite3FaultSim(0) becomes the return from
    ** sqlite3_test_control().
    */
    case SQLITE_TESTCTRL_FAULT_INSTALL: {
      /* MSVC is picky about pulling func ptrs from va lists.
      ** http://support.microsoft.com/kb/47961
      ** sqlite3GlobalConfig.xTestCallback = va_arg(ap, int(*)(int));
      */
      typedef int(*TESTCALLBACKFUNC_t)(int);
      sqlite3GlobalConfig.xTestCallback = va_arg(ap, TESTCALLBACKFUNC_t);
      rc = sqlite3FaultSim(0);
      break;
    }

    /*
    **  sqlite3_test_control(BENIGN_MALLOC_HOOKS, xBegin, xEnd)
    **
    ** Register hooks to call to indicate which malloc() failures 
    ** are benign.
    */
    case SQLITE_TESTCTRL_BENIGN_MALLOC_HOOKS: {
      typedef void (*void_function)(void);
      void_function xBenignBegin;
      void_function xBenignEnd;
      xBenignBegin = va_arg(ap, void_function);
      xBenignEnd = va_arg(ap, void_function);
      sqlite3BenignMallocHooks(xBenignBegin, xBenignEnd);
      break;
    }

    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_PENDING_BYTE, unsigned int X)
    **
    ** Set the PENDING byte to the value in the argument, if X>0.
    ** Make no changes if X==0.  Return the value of the pending byte
    ** as it existing before this routine was called.
    **
    ** IMPORTANT:  Changing the PENDING byte from 0x40000000 results in
    ** an incompatible database file format.  Changing the PENDING byte
    ** while any database connection is open results in undefined and
    ** deleterious behavior.
    */
    case SQLITE_TESTCTRL_PENDING_BYTE: {
      rc = PENDING_BYTE;
#ifndef SQLITE_OMIT_WSD
      {
        unsigned int newVal = va_arg(ap, unsigned int);
        if( newVal ) sqlite3PendingByte = newVal;
      }
#endif
      break;
    }

    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_ASSERT, int X)
    **
    ** This action provides a run-time test to see whether or not
    ** assert() was enabled at compile-time.  If X is true and assert()
    ** is enabled, then the return value is true.  If X is true and
    ** assert() is disabled, then the return value is zero.  If X is
    ** false and assert() is enabled, then the assertion fires and the
    ** process aborts.  If X is false and assert() is disabled, then the
    ** return value is zero.
    */
    case SQLITE_TESTCTRL_ASSERT: {
      volatile int x = 0;
      assert( /*side-effects-ok*/ (x = va_arg(ap,int))!=0 );
      rc = x;
      break;
    }


    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_ALWAYS, int X)
    **
    ** This action provides a run-time test to see how the ALWAYS and
    ** NEVER macros were defined at compile-time.
    **
    ** The return value is ALWAYS(X).  
    **
    ** The recommended test is X==2.  If the return value is 2, that means
    ** ALWAYS() and NEVER() are both no-op pass-through macros, which is the
    ** default setting.  If the return value is 1, then ALWAYS() is either
    ** hard-coded to true or else it asserts if its argument is false.
    ** The first behavior (hard-coded to true) is the case if
    ** SQLITE_TESTCTRL_ASSERT shows that assert() is disabled and the second
    ** behavior (assert if the argument to ALWAYS() is false) is the case if
    ** SQLITE_TESTCTRL_ASSERT shows that assert() is enabled.
    **
    ** The run-time test procedure might look something like this:
    **
    **    if( sqlite3_test_control(SQLITE_TESTCTRL_ALWAYS, 2)==2 ){
    **      // ALWAYS() and NEVER() are no-op pass-through macros
    **    }else if( sqlite3_test_control(SQLITE_TESTCTRL_ASSERT, 1) ){
    **      // ALWAYS(x) asserts that x is true. NEVER(x) asserts x is false.
    **    }else{
    **      // ALWAYS(x) is a constant 1.  NEVER(x) is a constant 0.
    **    }
    */
    case SQLITE_TESTCTRL_ALWAYS: {
      int x = va_arg(ap,int);
      rc = ALWAYS(x);
      break;
    }

    /*
    **   sqlite3_test_control(SQLITE_TESTCTRL_BYTEORDER);
    **
    ** The integer returned reveals the byte-order of the computer on which
    ** SQLite is running:
    **
    **       1     big-endian,    determined at run-time
    **      10     little-endian, determined at run-time
    **  432101     big-endian,    determined at compile-time
    **  123410     little-endian, determined at compile-time
    */ 
    case SQLITE_TESTCTRL_BYTEORDER: {
      rc = SQLITE_BYTEORDER*100 + SQLITE_LITTLEENDIAN*10 + SQLITE_BIGENDIAN;
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_RESERVE, sqlite3 *db, int N)
    **
    ** Set the nReserve size to N for the main database on the database
    ** connection db.
    */
    case SQLITE_TESTCTRL_RESERVE: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      int x = va_arg(ap,int);
      sqlite3_mutex_enter(db->mutex);
      sqlite3BtreeSetPageSize(db->aDb[0].pBt, 0, x, 0);
      sqlite3_mutex_leave(db->mutex);
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_OPTIMIZATIONS, sqlite3 *db, int N)
    **
    ** Enable or disable various optimizations for testing purposes.  The 
    ** argument N is a bitmask of optimizations to be disabled.  For normal
    ** operation N should be 0.  The idea is that a test program (like the
    ** SQL Logic Test or SLT test module) can run the same SQL multiple times
    ** with various optimizations disabled to verify that the same answer
    ** is obtained in every case.
    */
    case SQLITE_TESTCTRL_OPTIMIZATIONS: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->dbOptFlags = (u16)(va_arg(ap, int) & 0xffff);
      break;
    }

#ifdef SQLITE_N_KEYWORD
    /* sqlite3_test_control(SQLITE_TESTCTRL_ISKEYWORD, const char *zWord)
    **
    ** If zWord is a keyword recognized by the parser, then return the
    ** number of keywords.  Or if zWord is not a keyword, return 0.
    ** 
    ** This test feature is only available in the amalgamation since
    ** the SQLITE_N_KEYWORD macro is not defined in this file if SQLite
    ** is built using separate source files.
    */
    case SQLITE_TESTCTRL_ISKEYWORD: {
      const char *zWord = va_arg(ap, const char*);
      int n = sqlite3Strlen30(zWord);
      rc = (sqlite3KeywordCode((u8*)zWord, n)!=TK_ID) ? SQLITE_N_KEYWORD : 0;
      break;
    }
#endif 

    /* sqlite3_test_control(SQLITE_TESTCTRL_SCRATCHMALLOC, sz, &pNew, pFree);
    **
    ** Pass pFree into sqlite3ScratchFree(). 
    ** If sz>0 then allocate a scratch buffer into pNew.  
    */
    case SQLITE_TESTCTRL_SCRATCHMALLOC: {
      void *pFree, **ppNew;
      int sz;
      sz = va_arg(ap, int);
      ppNew = va_arg(ap, void**);
      pFree = va_arg(ap, void*);
      if( sz ) *ppNew = sqlite3ScratchMalloc(sz);
      sqlite3ScratchFree(pFree);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_LOCALTIME_FAULT, int onoff);
    **
    ** If parameter onoff is non-zero, configure the wrappers so that all
    ** subsequent calls to localtime() and variants fail. If onoff is zero,
    ** undo this setting.
    */
    case SQLITE_TESTCTRL_LOCALTIME_FAULT: {
      sqlite3GlobalConfig.bLocaltimeFault = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_NEVER_CORRUPT, int);
    **
    ** Set or clear a flag that indicates that the database file is always well-
    ** formed and never corrupt.  This flag is clear by default, indicating that
    ** database files might have arbitrary corruption.  Setting the flag during
    ** testing causes certain assert() statements in the code to be activated
    ** that demonstrat invariants on well-formed database files.
    */
    case SQLITE_TESTCTRL_NEVER_CORRUPT: {
      sqlite3GlobalConfig.neverCorrupt = va_arg(ap, int);
      break;
    }

    /* Set the threshold at which OP_Once counters reset back to zero.
    ** By default this is 0x7ffffffe (over 2 billion), but that value is
    ** too big to test in a reasonable amount of time, so this control is
    ** provided to set a small and easily reachable reset value.
    */
    case SQLITE_TESTCTRL_ONCE_RESET_THRESHOLD: {
      sqlite3GlobalConfig.iOnceResetThreshold = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_VDBE_COVERAGE, xCallback, ptr);
    **
    ** Set the VDBE coverage callback function to xCallback with context 
    ** pointer ptr.
    */
    case SQLITE_TESTCTRL_VDBE_COVERAGE: {
#ifdef SQLITE_VDBE_COVERAGE
      typedef void (*branch_callback)(void*,int,u8,u8);
      sqlite3GlobalConfig.xVdbeBranch = va_arg(ap,branch_callback);
      sqlite3GlobalConfig.pVdbeBranchArg = va_arg(ap,void*);
#endif
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_SORTER_MMAP, db, nMax); */
    case SQLITE_TESTCTRL_SORTER_MMAP: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->nMaxSorterMmap = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_ISINIT);
    **
    ** Return SQLITE_OK if SQLite has been initialized and SQLITE_ERROR if
    ** not.
    */
    case SQLITE_TESTCTRL_ISINIT: {
      if( sqlite3GlobalConfig.isInit==0 ) rc = SQLITE_ERROR;
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, db, dbName, onOff, tnum);
    **
    ** This test control is used to create imposter tables.  "db" is a pointer
    ** to the database connection.  dbName is the database name (ex: "main" or
    ** "temp") which will receive the imposter.  "onOff" turns imposter mode on
    ** or off.  "tnum" is the root page of the b-tree to which the imposter
    ** table should connect.
    **
    ** Enable imposter mode only when the schema has already been parsed.  Then
    ** run a single CREATE TABLE statement to construct the imposter table in
    ** the parsed schema.  Then turn imposter mode back off again.
    **
    ** If onOff==0 and tnum>0 then reset the schema for all databases, causing
    ** the schema to be reparsed the next time it is needed.  This has the
    ** effect of erasing all imposter tables.
    */
    case SQLITE_TESTCTRL_IMPOSTER: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      sqlite3_mutex_enter(db->mutex);
      db->init.iDb = sqlite3FindDbName(db, va_arg(ap,const char*));
      db->init.busy = db->init.imposterTable = va_arg(ap,int);
      db->init.newTnum = va_arg(ap,int);
      if( db->init.busy==0 && db->init.newTnum>0 ){
        sqlite3ResetAllSchemasOfConnection(db);
      }
      sqlite3_mutex_leave(db->mutex);
      break;
    }
  }
  va_end(ap);
#endif /* SQLITE_UNTESTABLE */
  return rc;
}